

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

int __thiscall
icu_63::PluralRules::clone
          (PluralRules *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UBool UVar1;
  PluralRules *this_00;
  PluralRules *local_38;
  int local_18;
  PluralRules *newObj;
  PluralRules *this_local;
  
  this_00 = (PluralRules *)UMemory::operator_new((UMemory *)0x18,(size_t)__fn);
  local_38 = (PluralRules *)0x0;
  if (this_00 != (PluralRules *)0x0) {
    PluralRules(this_00,this);
    local_38 = this_00;
  }
  local_18 = (int)local_38;
  if (local_38 != (PluralRules *)0x0) {
    UVar1 = ::U_FAILURE(local_38->mInternalStatus);
    if (UVar1 != '\0') {
      if (local_38 != (PluralRules *)0x0) {
        (*(local_38->super_UObject)._vptr_UObject[1])();
      }
      local_18 = 0;
    }
  }
  return local_18;
}

Assistant:

PluralRules*
PluralRules::clone() const {
    PluralRules* newObj = new PluralRules(*this);
    // Since clone doesn't have a 'status' parameter, the best we can do is return nullptr if
    // the newly created object was not fully constructed properly (an error occurred).
    if (newObj != nullptr && U_FAILURE(newObj->mInternalStatus)) {
        delete newObj;
        newObj = nullptr;
    }
    return newObj;
}